

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateBuilderParsingCode
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  string_view text;
  
  bVar1 = SupportUnknownEnumValue((this->super_ImmutableEnumFieldGenerator).descriptor_);
  if (bVar1) {
    pcVar2 = 
    "int tmpRaw = input.readEnum();\nensure$capitalized_name$IsMutable();\n$name$_.addInt(tmpRaw);\n"
    ;
    sVar3 = 0x5c;
  }
  else {
    pcVar2 = 
    "int tmpRaw = input.readEnum();\n$type$ tmpValue =\n    $type$.forNumber(tmpRaw);\nif (tmpValue == null) {\n  mergeUnknownVarintField($number$, tmpRaw);\n} else {\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(tmpRaw);\n}\n"
    ;
    sVar3 = 0xe0;
  }
  text._M_str = pcVar2;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableEnumFieldGenerator).variables_,text);
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  // Read and store the enum
  if (SupportUnknownEnumValue(descriptor_)) {
    printer->Print(variables_,
                   "int tmpRaw = input.readEnum();\n"
                   "ensure$capitalized_name$IsMutable();\n"
                   "$name$_.addInt(tmpRaw);\n");
  } else {
    printer->Print(variables_,
                   "int tmpRaw = input.readEnum();\n"
                   "$type$ tmpValue =\n"
                   "    $type$.forNumber(tmpRaw);\n"
                   "if (tmpValue == null) {\n"
                   "  mergeUnknownVarintField($number$, tmpRaw);\n"
                   "} else {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.addInt(tmpRaw);\n"
                   "}\n");
  }
}